

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

Value * __thiscall HawkTracer::parser::Event::Value::operator=(Value *this,Value *other)

{
  Value *other_local;
  Value *this_local;
  
  _swap(this,other);
  return this;
}

Assistant:

Event::Value& Event::Value::operator=(Value other)
{
    _swap(other);
    return *this;
}